

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu2_v2.c
# Opt level: O0

MPP_RET hal_h264e_vepu2_gen_regs_v2(void *hal,HalEncTask *task)

{
  EncRcTask *pEVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  uint uVar5;
  RK_S32 RVar6;
  int *piVar7;
  EncFrmStatus *frm_00;
  RK_U32 *reg_00;
  size_t sVar8;
  MppBuffer buffer;
  int local_200;
  RK_U8 local_1dc;
  int local_1d8;
  uint local_1d4;
  uint local_1d0;
  uint local_1cc;
  int local_1c8;
  RK_S32 nal_size_table_fd;
  MppBuffer nal_size_table;
  RK_U8 dmv_qpel_penalty [128];
  RK_U8 dmv_penalty [128];
  RK_U32 diff_mv_penalty [3];
  RK_S32 cabac_table_fd;
  MppBuffer cabac_table;
  RK_U32 overfill_b;
  RK_U32 overfill_r;
  RK_U32 skip_penalty;
  RK_U32 scaler;
  RK_S32 i;
  RK_U32 val;
  RK_U32 first_free_bit;
  RK_U32 offset;
  RK_U32 mb_h;
  RK_U32 mb_w;
  RK_U32 *reg;
  H264eSlice *slice;
  H264ePps *pps;
  H264eSps *sps;
  EncFrmStatus *frm;
  EncRcTaskInfo *rc_info;
  VepuOffsetCfg *hw_offset;
  HalH264eVepuMbRc *hw_mbrc;
  HalH264eVepuAddr *hw_addr;
  HalH264eVepuPrep *hw_prep;
  HalH264eVepuBufs *hw_bufs;
  HalH264eVepu2Ctx *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  piVar7 = (int *)((long)hal + 0x198);
  pEVar1 = task->rc_task;
  frm_00 = &task->rc_task->frm;
  piVar2 = *(int **)((long)hal + 0x260);
  piVar3 = *(int **)((long)hal + 0x268);
  lVar4 = *(long *)((long)hal + 0x270);
  reg_00 = (RK_U32 *)((long)hal + 0x300);
  offset = *(RK_U32 *)(*(long *)((long)hal + 0x260) + 0x3c);
  first_free_bit = *(RK_U32 *)(*(long *)((long)hal + 0x260) + 0x40);
  sVar8 = mpp_packet_get_length(task->packet);
  if (*(int *)((long)hal + 0x144) != 0) {
    offset = *(RK_U32 *)(*(long *)((long)hal + 0x260) + 0x40);
    first_free_bit = *(RK_U32 *)(*(long *)((long)hal + 0x260) + 0x3c);
  }
  *piVar7 = (pEVar1->info).quality_target;
  *(RK_S32 *)((long)hal + 0x1a0) = (pEVar1->info).quality_max;
  *(RK_S32 *)((long)hal + 0x19c) = (pEVar1->info).quality_min;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu2_v2","enter %p\n","hal_h264e_vepu2_gen_regs_v2",hal);
  }
  if ((hal_h264e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu2_v2","frame %d generate regs now","hal_h264e_vepu2_gen_regs_v2",
               frm_00->val >> 0x30);
  }
  h264e_vepu_mbrc_prepare
            (*(HalH264eVepuMbRcCtx *)((long)hal + 0x2f8),(HalH264eVepuMbRc *)((long)hal + 0x198),
             task->rc_task);
  h264e_vepu_slice_split_cfg
            (*(H264eSlice **)((long)hal + 0x270),(HalH264eVepuMbRc *)((long)hal + 0x198),
             task->rc_task,*hal);
  uVar5 = setup_output_packet((HalH264eVepu2Ctx *)hal,reg_00,task->output,(RK_U32)sVar8);
  *(RK_U32 *)((long)hal + 0x214) = (RK_U32)sVar8;
  *(uint *)((long)hal + 0x218) = uVar5 >> 3;
  *(undefined4 *)((long)hal + 0x21c) = 0;
  setup_intra_refresh((HalH264eVepu2Ctx *)hal,frm_00);
  *(undefined4 *)((long)hal + 0x3d8) = 0x1000;
  *(undefined4 *)((long)hal + 0x3dc) = *(undefined4 *)((long)hal + 0x208);
  scaler = 0;
  if (0xe10 < offset * first_free_bit) {
    scaler = 0x10000000;
  }
  scaler = (*(uint *)(lVar4 + 0x40) & 3) << 0x15 | scaler;
  if (piVar3[2] != 0) {
    scaler = scaler | 0x100000;
  }
  if (piVar3[0x11] != 0) {
    scaler = scaler | 0x20000;
  }
  if (0x1f < *piVar2) {
    scaler = scaler | 0x10000;
  }
  *(uint *)((long)hal + 0x3ec) = (*(uint *)((long)hal + 0x210) & 0x7f) << 8 | scaler;
  if ((int)(200 / (ulong)(offset + first_free_bit)) == 0) {
    local_1c8 = 1;
  }
  else {
    local_1c8 = (int)(200 / (ulong)(offset + first_free_bit));
  }
  if (h264_skip_sad_penalty[*piVar7] * local_1c8 < 0xff) {
    local_1cc = h264_skip_sad_penalty[*piVar7] * local_1c8;
  }
  else {
    local_1cc = 0xff;
  }
  if ((*(uint *)((long)hal + 0xe4) & 0xf) == 0) {
    local_1d0 = 0;
  }
  else {
    local_1d0 = (int)(0x10 - (*(uint *)((long)hal + 0xe4) & 0xf)) / 4;
  }
  if ((*(uint *)((long)hal + 0xe8) & 0xf) == 0) {
    local_1d4 = 0;
  }
  else {
    local_1d4 = 0x10 - (*(uint *)((long)hal + 0xe8) & 0xf);
  }
  *(uint *)((long)hal + 0x3f0) =
       (uVar5 & 0x3f) << 0x10 | (local_1cc & 0xff) << 8 | (local_1d0 & 3) << 4 | local_1d4 & 0xf;
  *(uint *)((long)hal + 0x3f4) = *(uint *)((long)hal + 0x108) & 0x3fff;
  *(uint *)((long)hal + 0x404) =
       *(int *)((long)hal + 0x1a8) << 0x10 | *(uint *)((long)hal + 0x1ac) & 0xffff;
  *(uint *)((long)hal + 0x408) =
       *(int *)((long)hal + 0x1b0) << 0x10 | *(uint *)((long)hal + 0x1b4) & 0xffff;
  *(uint *)((long)hal + 0x40c) =
       *(int *)((long)hal + 0x1b8) << 0x10 | *(uint *)((long)hal + 0x1bc) & 0xffff;
  *(uint *)((long)hal + 0x410) =
       *(int *)((long)hal + 0x1c0) << 0x10 | *(uint *)((long)hal + 0x1c4) & 0xffff;
  *(uint *)((long)hal + 0x414) =
       *(int *)((long)hal + 0x1c8) << 0x10 | *(uint *)((long)hal + 0x1cc) & 0xffff;
  *(uint *)((long)hal + 0x418) =
       *(int *)((long)hal + 0x1d0) << 0x10 | *(uint *)((long)hal + 0x1d4) & 0xffff;
  *(uint *)((long)hal + 0x41c) =
       *(int *)((long)hal + 0x1d8) << 0x10 | *(uint *)((long)hal + 0x1dc) & 0xffff;
  *(uint *)((long)hal + 0x420) =
       *(int *)((long)hal + 0x1e0) << 0x10 | *(uint *)((long)hal + 0x1e4) & 0xffff;
  *(uint *)((long)hal + 0x424) =
       (*(uint *)((long)hal + 0x204) & 0xf) << 0x18 | (*(uint *)((long)hal + 0x200) & 0xf) << 0x14 |
       (*(uint *)((long)hal + 0x1fc) & 0xf) << 0x10 | (*(uint *)((long)hal + 0x1f8) & 0xf) << 0xc |
       (*(uint *)((long)hal + 500) & 0xf) << 8 | (*(uint *)((long)hal + 0x1f0) & 0xf) << 4 |
       *(uint *)((long)hal + 0x1ec) & 0xf;
  *(uint *)((long)hal + 0x428) =
       (*(uint *)((long)hal + 0x20c) & 0x3f) << 0x18 | (*(uint *)((long)hal + 0xe0) & 0xf) << 4 |
       (*(uint *)((long)hal + 0x144) & 3) << 2 | 1;
  *(RK_U32 *)((long)hal + 0x42c) =
       h264_intra16_favor[*piVar7] << 0x10 | h264_inter_favor[*piVar7] & 0xffff;
  scaler = piVar3[9] << 0x1a | (*(uint *)(lVar4 + 0x48) & 0xf) << 0x16 |
           (*(uint *)(lVar4 + 0x4c) & 0xf) << 0x12 | (piVar3[0xb] & 0x1fU) << 0xd |
           (*(uint *)(lVar4 + 0x6c) & 0xf) << 1;
  if (*(int *)(lVar4 + 0x44) != 0) {
    scaler = scaler | 0x20;
  }
  if (piVar3[0xf] != 0) {
    scaler = scaler | 1;
  }
  *(RK_U32 *)((long)hal + 0x430) = scaler;
  *(undefined4 *)((long)hal + 0x43c) = 0;
  *(undefined4 *)((long)hal + 0x440) = 0;
  if (*(MppBuffer *)((long)hal + 0x28) == (MppBuffer)0x0) {
    local_1d8 = 0;
  }
  else {
    local_1d8 = mpp_buffer_get_fd_with_caller
                          (*(MppBuffer *)((long)hal + 0x28),"hal_h264e_vepu2_gen_regs_v2");
  }
  *(int *)((long)hal + 0x444) = local_1d8;
  *(RK_U32 *)((long)hal + 0x448) =
       first_free_bit << 0x18 | (first_free_bit & 0xff) << 0x10 | (offset & 0xff) << 8 |
       offset & 0xff;
  *(RK_U32 *)((long)hal + 0x44c) =
       first_free_bit << 0x18 | (first_free_bit & 0xff) << 0x10 | (offset & 0xff) << 8 |
       offset & 0xff;
  *(undefined4 *)((long)hal + 0x478) = 0;
  *(uint *)((long)hal + 0x47c) =
       *(int *)((long)hal + 0x134) << 0x10 | *(uint *)((long)hal + 0x130) & 0xffff;
  *(uint *)((long)hal + 0x480) =
       *(int *)((long)hal + 0x13c) << 0x10 | *(uint *)((long)hal + 0x138) & 0xffff;
  *(uint *)((long)hal + 0x484) = *(uint *)((long)hal + 0x140) & 0xffff;
  *(uint *)((long)hal + 0x488) =
       (*(byte *)((long)hal + 0x12a) & 0x1f) << 0x10 | (*(byte *)((long)hal + 0x129) & 0x1f) << 8 |
       *(byte *)((long)hal + 0x128) & 0x1f;
  memset(dmv_penalty + 0x78,0,0xc);
  dmv_penalty._120_4_ = h264_diff_mv_penalty4p[*piVar7];
  dmv_penalty._124_4_ = h264_diff_mv_penalty[*piVar7];
  *(uint *)((long)hal + 0x48c) =
       (dmv_penalty._124_4_ & 0x3ff) << 0x15 | (h264_diff_mv_penalty[*piVar7] & 0x3ff) << 0xb |
       (dmv_penalty._120_4_ & 0x3ff) << 1 | 1;
  *(uint *)((long)hal + 0x490) =
       *piVar7 << 0x1a | (*(uint *)((long)hal + 0x1a0) & 0x3f) << 0x14 |
       (*(uint *)((long)hal + 0x19c) & 0x3f) << 0xe | *(uint *)((long)hal + 0x1a4) & 0xfff;
  *(undefined4 *)((long)hal + 0x498) = 0xa00000;
  *(uint *)((long)hal + 0x4a4) =
       (uint)*(byte *)((long)hal + 299) << 0x1f | 0x1c000000 |
       (*(byte *)((long)hal + 300) & 1) << 0x1e | (*(byte *)((long)hal + 0x12d) & 1) << 0x1d;
  *(RK_U32 *)((long)hal + 0x4a8) =
       *piVar3 << 0x18 | (h264_prev_mode_favor[*piVar7] & 0xff) << 0x10 |
       *(uint *)(lVar4 + 0x34) & 0xffff;
  *(undefined4 *)((long)hal + 0x4b4) = 0x400;
  memset(dmv_qpel_penalty + 0x78,0,0x80);
  memset(&nal_size_table,0,0x80);
  for (skip_penalty = 0; (int)skip_penalty < 0x80; skip_penalty = skip_penalty + 1) {
    dmv_qpel_penalty[(long)(int)skip_penalty + 0x78] = (RK_U8)skip_penalty;
    RVar6 = exp_golomb_signed(skip_penalty);
    if (RVar6 < 0xff) {
      RVar6 = exp_golomb_signed(skip_penalty);
      local_1dc = (RK_U8)RVar6;
    }
    else {
      local_1dc = 0xff;
    }
    dmv_qpel_penalty[(long)(int)skip_penalty + -8] = local_1dc;
  }
  for (skip_penalty = 0; (int)skip_penalty < 0x80; skip_penalty = skip_penalty + 4) {
    reg_00[((int)skip_penalty / 4) * 4 + 0x1e0 >> 2] =
         (uint)dmv_qpel_penalty[(long)(int)(skip_penalty + 3) + 0x78] |
         (uint)dmv_qpel_penalty[(long)(int)(skip_penalty + 2) + 0x78] << 8 |
         (uint)dmv_qpel_penalty[(long)(int)(skip_penalty + 1) + 0x78] << 0x10 |
         (uint)dmv_qpel_penalty[(long)(int)skip_penalty + 0x78] << 0x18;
    reg_00[((int)skip_penalty / 4) * 4 + 0x260 >> 2] =
         (uint)dmv_qpel_penalty[(long)(int)(skip_penalty + 3) + -8] |
         (uint)dmv_qpel_penalty[(long)(int)(skip_penalty + 2) + -8] << 8 |
         (uint)dmv_qpel_penalty[(long)(int)(skip_penalty + 1) + -8] << 0x10 |
         (uint)dmv_qpel_penalty[(long)(int)skip_penalty + -8] << 0x18;
  }
  *(undefined4 *)((long)hal + 0x3c0) = *(undefined4 *)((long)hal + 0x148);
  if (*(int *)((long)hal + 0x180) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x30,*(RK_U32 *)((long)hal + 0x180));
  }
  *(undefined4 *)((long)hal + 0x3c4) = *(undefined4 *)((long)hal + 0x14c);
  if (*(int *)((long)hal + 0x184) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x31,*(RK_U32 *)((long)hal + 0x184));
  }
  *(undefined4 *)((long)hal + 0x3c8) = *(undefined4 *)((long)hal + 0x150);
  if (*(int *)((long)hal + 0x188) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x32,*(RK_U32 *)((long)hal + 0x188));
  }
  buffer = h264e_vepu_buf_get_nal_size_table((HalH264eVepuBufs *)((long)hal + 0x18));
  if (buffer == (MppBuffer)0x0) {
    local_200 = 0;
  }
  else {
    local_200 = mpp_buffer_get_fd_with_caller(buffer,"hal_h264e_vepu2_gen_regs_v2");
  }
  *(int *)((long)hal + 0x438) = local_200;
  *(undefined4 *)((long)hal + 0x3fc) = *(undefined4 *)((long)hal + 0x154);
  *(undefined4 *)((long)hal + 0x400) = *(undefined4 *)((long)hal + 0x158);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x40,(RK_U32)*(undefined8 *)((long)hal + 0x48));
  *(undefined4 *)((long)hal + 0x3e0) = *(undefined4 *)((long)hal + 0x15c);
  *(undefined4 *)((long)hal + 0x3e4) = *(undefined4 *)((long)hal + 0x160);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x39,(RK_U32)*(undefined8 *)((long)hal + 0x48));
  *(RK_U32 *)((long)hal + 0x49c) =
       (first_free_bit & 0x1ff) << 0x14 | (offset & 0x1ff) << 8 | (*(uint *)(lVar4 + 0x68) & 3) << 6
       | 0x31;
  *(int *)((long)hal + 0x10) = *(int *)((long)hal + 0x10) + 1;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu2_v2","leave %p\n","hal_h264e_vepu2_gen_regs_v2",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu2_gen_regs_v2(void *hal, HalEncTask *task)
{
    //MPP_RET ret = MPP_OK;
    HalH264eVepu2Ctx *ctx = (HalH264eVepu2Ctx *)hal;
    HalH264eVepuBufs *hw_bufs = &ctx->hw_bufs;
    HalH264eVepuPrep *hw_prep = &ctx->hw_prep;
    HalH264eVepuAddr *hw_addr = &ctx->hw_addr;
    HalH264eVepuMbRc *hw_mbrc = &ctx->hw_mbrc;
    VepuOffsetCfg *hw_offset = &ctx->hw_offset;
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    EncFrmStatus *frm = &task->rc_task->frm;
    H264eSps *sps = ctx->sps;
    H264ePps *pps = ctx->pps;
    H264eSlice *slice = ctx->slice;
    RK_U32 *reg = ctx->regs_set.val;
    RK_U32 mb_w = ctx->sps->pic_width_in_mbs;
    RK_U32 mb_h = ctx->sps->pic_height_in_mbs;
    RK_U32 offset = mpp_packet_get_length(task->packet);
    RK_U32 first_free_bit = 0;
    RK_U32 val = 0;
    RK_S32 i = 0;

    if (hw_prep->rotation) {
        mb_w = ctx->sps->pic_height_in_mbs;
        mb_h = ctx->sps->pic_width_in_mbs;
    }

    hw_mbrc->qp_init = rc_info->quality_target;
    hw_mbrc->qp_max = rc_info->quality_max;
    hw_mbrc->qp_min = rc_info->quality_min;

    hal_h264e_dbg_func("enter %p\n", hal);

    hal_h264e_dbg_detail("frame %d generate regs now", frm->seq_idx);

    // prepare mb rc config
    h264e_vepu_mbrc_prepare(ctx->rc_ctx, &ctx->hw_mbrc, task->rc_task);
    h264e_vepu_slice_split_cfg(ctx->slice, &ctx->hw_mbrc, task->rc_task, ctx->cfg);

    /* setup output address with offset */
    first_free_bit = setup_output_packet(ctx, reg, task->output, offset);

    /* set extra byte for header */
    hw_mbrc->hdr_strm_size = offset;
    hw_mbrc->hdr_free_size = first_free_bit / 8;
    hw_mbrc->out_strm_size = 0;

    /*
     * The hardware needs only the value for luma plane, because
     * values of other planes are calculated internally based on
     * format setting.
     */
    setup_intra_refresh(ctx, frm);

    val = VEPU_REG_AXI_CTRL_READ_ID(0);
    val |= VEPU_REG_AXI_CTRL_WRITE_ID(0);
    val |= VEPU_REG_AXI_CTRL_BURST_LEN(16);
    val |= VEPU_REG_AXI_CTRL_INCREMENT_MODE(0);
    val |= VEPU_REG_AXI_CTRL_BIRST_DISCARD(0);
    H264E_HAL_SET_REG(reg, VEPU_REG_AXI_CTRL, val);

    H264E_HAL_SET_REG(reg, VEPU_QP_ADJUST_MAD_DELTA_ROI,
                      hw_mbrc->mad_qp_change);

    val = 0;
    if (mb_w * mb_h > 3600)
        val = VEPU_REG_DISABLE_QUARTER_PIXEL_MV;
    val |= VEPU_REG_CABAC_INIT_IDC(slice->cabac_init_idc);
    if (pps->entropy_coding_mode)
        val |= VEPU_REG_ENTROPY_CODING_MODE;
    if (pps->transform_8x8_mode)
        val |= VEPU_REG_H264_TRANS8X8_MODE;
    if (sps->profile_idc > 31)
        val |= VEPU_REG_H264_INTER4X4_MODE;
    /*reg |= VEPU_REG_H264_STREAM_MODE;*/
    val |= VEPU_REG_H264_SLICE_SIZE(hw_mbrc->slice_size_mb_rows);
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_CTRL0, val);

    RK_U32 scaler = MPP_MAX(1, 200 / (mb_w + mb_h));

    RK_U32 skip_penalty = MPP_MIN(255, h264_skip_sad_penalty[hw_mbrc->qp_init] * scaler);

    RK_U32 overfill_r = (hw_prep->src_w & 0x0f) ?
                        ((16 - (hw_prep->src_w & 0x0f)) / 4) : 0;

    RK_U32 overfill_b = (hw_prep->src_h & 0x0f) ?
                        (16 - (hw_prep->src_h & 0x0f)) : 0;

    val = VEPU_REG_STREAM_START_OFFSET(first_free_bit) |
          VEPU_REG_SKIP_MACROBLOCK_PENALTY(skip_penalty) |
          VEPU_REG_IN_IMG_CTRL_OVRFLR_D4(overfill_r) |
          VEPU_REG_IN_IMG_CTRL_OVRFLB(overfill_b);
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_OVER_FILL_STRM_OFFSET, val);

    // When offset is zero row length should be total 16 aligned width
    val = VEPU_REG_IN_IMG_CHROMA_OFFSET(0)
          | VEPU_REG_IN_IMG_LUMA_OFFSET(0)
          | VEPU_REG_IN_IMG_CTRL_ROW_LEN(hw_prep->pixel_stride);

    H264E_HAL_SET_REG(reg, VEPU_REG_INPUT_LUMA_INFO, val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[0])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[1]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(0), val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[2])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[3]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(1), val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[4])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[5]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(2), val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[6])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[7]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(3), val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[8])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[9]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(4), val);

    val = VEPU_REG_CHKPT_WORD_ERR_CHK1(hw_mbrc->cp_error[0])
          | VEPU_REG_CHKPT_WORD_ERR_CHK0(hw_mbrc->cp_error[1]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHKPT_WORD_ERR(0), val);

    val = VEPU_REG_CHKPT_WORD_ERR_CHK1(hw_mbrc->cp_error[2])
          | VEPU_REG_CHKPT_WORD_ERR_CHK0(hw_mbrc->cp_error[3]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHKPT_WORD_ERR(1), val);

    val = VEPU_REG_CHKPT_WORD_ERR_CHK1(hw_mbrc->cp_error[4])
          | VEPU_REG_CHKPT_WORD_ERR_CHK0(hw_mbrc->cp_error[5]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHKPT_WORD_ERR(2), val);

    val = VEPU_REG_CHKPT_DELTA_QP_CHK6(hw_mbrc->cp_delta_qp[6])
          | VEPU_REG_CHKPT_DELTA_QP_CHK5(hw_mbrc->cp_delta_qp[5])
          | VEPU_REG_CHKPT_DELTA_QP_CHK4(hw_mbrc->cp_delta_qp[4])
          | VEPU_REG_CHKPT_DELTA_QP_CHK3(hw_mbrc->cp_delta_qp[3])
          | VEPU_REG_CHKPT_DELTA_QP_CHK2(hw_mbrc->cp_delta_qp[2])
          | VEPU_REG_CHKPT_DELTA_QP_CHK1(hw_mbrc->cp_delta_qp[1])
          | VEPU_REG_CHKPT_DELTA_QP_CHK0(hw_mbrc->cp_delta_qp[0]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHKPT_DELTA_QP, val);

    val = VEPU_REG_MAD_THRESHOLD(hw_mbrc->mad_threshold)
          | VEPU_REG_IN_IMG_CTRL_FMT(hw_prep->src_fmt)
          | VEPU_REG_IN_IMG_ROTATE_MODE(hw_prep->rotation)
          | VEPU_REG_SIZE_TABLE_PRESENT; //FIXED
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_CTRL1, val);

    val = VEPU_REG_INTRA16X16_MODE(h264_intra16_favor[hw_mbrc->qp_init])
          | VEPU_REG_INTER_MODE(h264_inter_favor[hw_mbrc->qp_init]);
    H264E_HAL_SET_REG(reg, VEPU_REG_INTRA_INTER_MODE, val);

    val = VEPU_REG_PPS_INIT_QP(pps->pic_init_qp)
          | VEPU_REG_SLICE_FILTER_ALPHA(slice->slice_alpha_c0_offset_div2)
          | VEPU_REG_SLICE_FILTER_BETA(slice->slice_beta_offset_div2)
          | VEPU_REG_CHROMA_QP_OFFSET(pps->chroma_qp_index_offset)
          | VEPU_REG_IDR_PIC_ID(slice->idr_pic_id);

    if (slice->disable_deblocking_filter_idc)
        val |= VEPU_REG_FILTER_DISABLE;

    if (pps->constrained_intra_pred)
        val |= VEPU_REG_CONSTRAINED_INTRA_PREDICTION;
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_CTRL2, val);

    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_NEXT_PIC, 0);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_MV_OUT, 0);

    MppBuffer cabac_table = hw_bufs->cabac_table;
    RK_S32 cabac_table_fd = cabac_table ? mpp_buffer_get_fd(cabac_table) : 0;

    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_CABAC_TBL, cabac_table_fd);

    val = VEPU_REG_ROI1_TOP_MB(mb_h)
          | VEPU_REG_ROI1_BOTTOM_MB(mb_h)
          | VEPU_REG_ROI1_LEFT_MB(mb_w)
          | VEPU_REG_ROI1_RIGHT_MB(mb_w);
    H264E_HAL_SET_REG(reg, VEPU_REG_ROI1, val);

    val = VEPU_REG_ROI2_TOP_MB(mb_h)
          | VEPU_REG_ROI2_BOTTOM_MB(mb_h)
          | VEPU_REG_ROI2_LEFT_MB(mb_w)
          | VEPU_REG_ROI2_RIGHT_MB(mb_w);
    H264E_HAL_SET_REG(reg, VEPU_REG_ROI2, val);
    H264E_HAL_SET_REG(reg, VEPU_REG_STABLILIZATION_OUTPUT, 0);

    val = VEPU_REG_RGB2YUV_CONVERSION_COEFB(hw_prep->color_conversion_coeff_b)
          | VEPU_REG_RGB2YUV_CONVERSION_COEFA(hw_prep->color_conversion_coeff_a);
    H264E_HAL_SET_REG(reg, VEPU_REG_RGB2YUV_CONVERSION_COEF1, val);

    val = VEPU_REG_RGB2YUV_CONVERSION_COEFE(hw_prep->color_conversion_coeff_e)
          | VEPU_REG_RGB2YUV_CONVERSION_COEFC(hw_prep->color_conversion_coeff_c);
    H264E_HAL_SET_REG(reg, VEPU_REG_RGB2YUV_CONVERSION_COEF2, val);

    val = VEPU_REG_RGB2YUV_CONVERSION_COEFF(hw_prep->color_conversion_coeff_f);
    H264E_HAL_SET_REG(reg, VEPU_REG_RGB2YUV_CONVERSION_COEF3, val);

    val = VEPU_REG_RGB_MASK_B_MSB(hw_prep->b_mask_msb)
          | VEPU_REG_RGB_MASK_G_MSB(hw_prep->g_mask_msb)
          | VEPU_REG_RGB_MASK_R_MSB(hw_prep->r_mask_msb);
    H264E_HAL_SET_REG(reg, VEPU_REG_RGB_MASK_MSB, val); //FIXED

    {
        RK_U32 diff_mv_penalty[3] = {0};
        diff_mv_penalty[0] = h264_diff_mv_penalty4p[hw_mbrc->qp_init];
        diff_mv_penalty[1] = h264_diff_mv_penalty[hw_mbrc->qp_init];
        diff_mv_penalty[2] = h264_diff_mv_penalty[hw_mbrc->qp_init];

        val = VEPU_REG_1MV_PENALTY(diff_mv_penalty[1])
              | VEPU_REG_QMV_PENALTY(diff_mv_penalty[2])
              | VEPU_REG_4MV_PENALTY(diff_mv_penalty[0]);
    }

    val |= VEPU_REG_SPLIT_MV_MODE_EN;
    H264E_HAL_SET_REG(reg, VEPU_REG_MV_PENALTY, val);

    val = VEPU_REG_H264_LUMA_INIT_QP(hw_mbrc->qp_init)
          | VEPU_REG_H264_QP_MAX(hw_mbrc->qp_max)
          | VEPU_REG_H264_QP_MIN(hw_mbrc->qp_min)
          | VEPU_REG_H264_CHKPT_DISTANCE(hw_mbrc->cp_distance_mbs);
    H264E_HAL_SET_REG(reg, VEPU_REG_QP_VAL, val);

    val = VEPU_REG_ZERO_MV_FAVOR_D2(10);
    H264E_HAL_SET_REG(reg, VEPU_REG_MVC_RELATE, val);

    val = VEPU_REG_OUTPUT_SWAP32
          | VEPU_REG_OUTPUT_SWAP16
          | VEPU_REG_OUTPUT_SWAP8
          | VEPU_REG_INPUT_SWAP8_(hw_prep->swap_8_in)
          | VEPU_REG_INPUT_SWAP16_(hw_prep->swap_16_in)
          | VEPU_REG_INPUT_SWAP32_(hw_prep->swap_32_in);
    H264E_HAL_SET_REG(reg, VEPU_REG_DATA_ENDIAN, val);

    val = VEPU_REG_PPS_ID(pps->pps_id)
          | VEPU_REG_INTRA_PRED_MODE(h264_prev_mode_favor[hw_mbrc->qp_init])
          | VEPU_REG_FRAME_NUM(slice->frame_num);
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_CTRL3, val);

    val = VEPU_REG_INTERRUPT_TIMEOUT_EN;
    H264E_HAL_SET_REG(reg, VEPU_REG_INTERRUPT, val);

    {
        RK_U8 dmv_penalty[128] = {0};
        RK_U8 dmv_qpel_penalty[128] = {0};

        for (i = 0; i < 128; i++) {
            dmv_penalty[i] = i;
            dmv_qpel_penalty[i] = MPP_MIN(255, exp_golomb_signed(i));
        }

        for (i = 0; i < 128; i += 4) {
            val = VEPU_REG_DMV_PENALTY_TABLE_BIT(dmv_penalty[i], 3);
            val |= VEPU_REG_DMV_PENALTY_TABLE_BIT(dmv_penalty[i + 1], 2);
            val |= VEPU_REG_DMV_PENALTY_TABLE_BIT(dmv_penalty[i + 2], 1);
            val |= VEPU_REG_DMV_PENALTY_TABLE_BIT(dmv_penalty[i + 3], 0);
            H264E_HAL_SET_REG(reg, VEPU_REG_DMV_PENALTY_TBL(i / 4), val);

            val = VEPU_REG_DMV_Q_PIXEL_PENALTY_TABLE_BIT(
                      dmv_qpel_penalty[i], 3);
            val |= VEPU_REG_DMV_Q_PIXEL_PENALTY_TABLE_BIT(
                       dmv_qpel_penalty[i + 1], 2);
            val |= VEPU_REG_DMV_Q_PIXEL_PENALTY_TABLE_BIT(
                       dmv_qpel_penalty[i + 2], 1);
            val |= VEPU_REG_DMV_Q_PIXEL_PENALTY_TABLE_BIT(
                       dmv_qpel_penalty[i + 3], 0);
            H264E_HAL_SET_REG(reg, VEPU_REG_DMV_Q_PIXEL_PENALTY_TBL(i / 4), val);
        }
    }

    /* set buffers addr */
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_IN_LUMA, hw_addr->orig[0]);
    if (hw_offset->offset_byte[0])
        mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_IN_LUMA >> 2,
                               hw_offset->offset_byte[0]);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_IN_CB, hw_addr->orig[1]);
    if (hw_offset->offset_byte[1])
        mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_IN_CB >> 2,
                               hw_offset->offset_byte[1]);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_IN_CR, hw_addr->orig[2]);
    if (hw_offset->offset_byte[2])
        mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_IN_CR >> 2,
                               hw_offset->offset_byte[2]);

    MppBuffer nal_size_table = h264e_vepu_buf_get_nal_size_table(hw_bufs);
    RK_S32 nal_size_table_fd = nal_size_table ? mpp_buffer_get_fd(nal_size_table) : 0;

    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_OUTPUT_CTRL, nal_size_table_fd);

    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_REC_LUMA,   hw_addr->recn[0]);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_REC_CHROMA, hw_addr->recn[1]);
    mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_REC_CHROMA >> 2, hw_bufs->yuv_size);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_REF_LUMA,   hw_addr->refr[0]);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_REF_CHROMA, hw_addr->refr[1]);
    mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_REF_CHROMA >> 2, hw_bufs->yuv_size);

    /* set important encode mode info */
    val = VEPU_REG_MB_HEIGHT(mb_h)
          | VEPU_REG_MB_WIDTH(mb_w)
          | VEPU_REG_PIC_TYPE(slice->idr_flag)
          | VEPU_REG_ENCODE_FORMAT(3)
          | VEPU_REG_ENCODE_ENABLE;
    H264E_HAL_SET_REG(reg, VEPU_REG_ENCODE_START, val);

    ctx->frame_cnt++;

    hal_h264e_dbg_func("leave %p\n", hal);
    return MPP_OK;
}